

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void add_reload(gen_ctx_t gen_ctx,MIR_insn_t anchor,MIR_op_t *op1,MIR_op_t *op2,MIR_type_t type,
               int to_p)

{
  MIR_context_t ctx;
  MIR_insn_t_conflict insn;
  char *pcVar1;
  MIR_insn_code_t code;
  
  if (type == MIR_T_F) {
    code = MIR_FMOV;
  }
  else if (type == MIR_T_D) {
    code = MIR_DMOV;
  }
  else {
    code = (uint)(type == MIR_T_LD) * 3;
  }
  ctx = gen_ctx->ctx;
  if (to_p == 0) {
    insn = MIR_new_insn(ctx,code);
    gen_add_insn_before(gen_ctx,anchor,insn);
  }
  else {
    insn = MIR_new_insn(ctx,code);
    gen_add_insn_after(gen_ctx,anchor,insn);
  }
  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    pcVar1 = "after";
    if (to_p == 0) {
      pcVar1 = "before";
    }
    fprintf((FILE *)gen_ctx->debug_file,"    Add %s insn",pcVar1);
    MIR_output_insn(ctx,gen_ctx->debug_file,anchor,(gen_ctx->curr_func_item->u).func,0);
    fwrite(": ",2,1,(FILE *)gen_ctx->debug_file);
    MIR_output_insn(ctx,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,1);
    return;
  }
  return;
}

Assistant:

static void add_reload (gen_ctx_t gen_ctx, MIR_insn_t anchor, const MIR_op_t *op1,
                        const MIR_op_t *op2, MIR_type_t type, int to_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_insn_t new_insn;
  MIR_insn_code_t move_code = get_move_code (type);
  if (to_p) {
    new_insn = MIR_new_insn (ctx, move_code, *op1, *op2);
    gen_add_insn_after (gen_ctx, anchor, new_insn);
  } else {
    new_insn = MIR_new_insn (ctx, move_code, *op2, *op1);
    gen_add_insn_before (gen_ctx, anchor, new_insn);
  }
  DEBUG (2, {
    fprintf (debug_file, "    Add %s insn", (to_p ? "after" : "before"));
    MIR_output_insn (ctx, debug_file, anchor, curr_func_item->u.func, FALSE);
    fprintf (debug_file, ": ");
    MIR_output_insn (ctx, debug_file, new_insn, curr_func_item->u.func, TRUE);
  });
}